

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_interface.cpp
# Opt level: O2

void __thiscall
RuntimeInterface::ForgetDebugMessenger(RuntimeInterface *this,XrDebugUtilsMessengerEXT messenger)

{
  XrDebugUtilsMessengerEXT local_18;
  
  if (messenger != (XrDebugUtilsMessengerEXT)0x0) {
    local_18 = messenger;
    std::mutex::lock(&this->_messenger_to_instance_mutex);
    std::
    _Hashtable<XrDebugUtilsMessengerEXT_T_*,_std::pair<XrDebugUtilsMessengerEXT_T_*const,_XrInstance_T_*>,_std::allocator<std::pair<XrDebugUtilsMessengerEXT_T_*const,_XrInstance_T_*>_>,_std::__detail::_Select1st,_std::equal_to<XrDebugUtilsMessengerEXT_T_*>,_std::hash<XrDebugUtilsMessengerEXT_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase(&(this->_messenger_to_instance_map)._M_h,&local_18);
    pthread_mutex_unlock((pthread_mutex_t *)&this->_messenger_to_instance_mutex);
  }
  return;
}

Assistant:

void RuntimeInterface::ForgetDebugMessenger(XrDebugUtilsMessengerEXT messenger) {
    if (XR_NULL_HANDLE != messenger) {
        std::lock_guard<std::mutex> mlock(_messenger_to_instance_mutex);
        _messenger_to_instance_map.erase(messenger);
    }
}